

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directive.cpp
# Opt level: O0

void __thiscall
ast::Dir_ascii::Dir_ascii
          (Dir_ascii *this,uint asciz,
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *sl,Location left)

{
  uint section;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  bool bVar1;
  uint size;
  reference pbVar2;
  uint8_t *data;
  string local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s;
  iterator __end1;
  iterator __begin1;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *sl_local;
  uint asciz_local;
  Dir_ascii *this_local;
  
  Directive::Directive(&this->super_Directive,left);
  (this->super_Directive).super_Statement._vptr_Statement = (_func_int **)&PTR__Dir_ascii_0017e850;
  this->string_list = sl;
  (this->super_Directive).super_Statement.section_index =
       *(uint *)(Sections::current_section + 0x20);
  (this->super_Directive).super_Statement.section_offset =
       *(uint *)(Sections::current_section + 0x30);
  this_00 = this->string_list;
  __end1 = std::__cxx11::
           list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(this_00);
  s.field_2._8_8_ =
       std::__cxx11::
       list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(this_00);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)((long)&s.field_2 + 8));
    if (!bVar1) break;
    pbVar2 = std::
             _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    std::__cxx11::string::string(local_70,(string *)pbVar2);
    section = *(uint *)(Sections::current_section + 0x20);
    data = (uint8_t *)std::__cxx11::string::data();
    size = std::__cxx11::string::size();
    Sections::append_block(section,data,size);
    if (asciz != 0) {
      Sections::append8(*(uint *)(Sections::current_section + 0x20),'\0');
    }
    std::__cxx11::string::~string(local_70);
    std::
    _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  (this->super_Directive).super_Statement.size_in_memory =
       *(int *)(Sections::current_section + 0x30) -
       (this->super_Directive).super_Statement.section_offset;
  return;
}

Assistant:

Dir_ascii::Dir_ascii(unsigned asciz, list<string> *sl, Location left) :
	Directive {left}, string_list {sl}
{
	section_index = Sections::current_section->number;
	section_offset = Sections::current_section->content_size;
	for (auto s: *string_list) {
		Sections::append_block(Sections::current_section->number, (const uint8_t *)s.data(), s.size());
		if (asciz)
			Sections::append8(Sections::current_section->number, 0);
	}
	size_in_memory = Sections::current_section->content_size - section_offset;
}